

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_offset_datetime<std::vector<char,std::allocator<char>>>
          (result<std::pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  local_date lVar1;
  const_iterator rollback;
  int iVar2;
  int iVar3;
  value_type *pvVar4;
  value_type *this_00;
  value_type *pvVar5;
  internal_error *piVar6;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_00
  ;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_01
  ;
  ushort uVar7;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *ctx;
  pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
  *this_01;
  ushort uVar8;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  allocator_type local_29a;
  allocator_type local_299;
  string local_298;
  undefined1 local_278 [40];
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  const_iterator local_238;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  inner_loc;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  ofs;
  string local_118;
  string local_f8;
  result<std::pair<toml::local_datetime,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  datetime;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>,toml::detail::either<toml::detail::character<(char)84>,toml::detail::character<(char)116>,toml::detail::character<(char)32>>,toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>,toml::detail::either<toml::detail::character<(char)90>,toml::detail::character<(char)122>,toml::detail::sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>>>>
  ::invoke<std::vector<char,std::allocator<char>>>
            (&token,(sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<4ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)45>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>,toml::detail::either<toml::detail::character<(char)84>,toml::detail::character<(char)116>,toml::detail::character<(char)32>>,toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>,toml::detail::either<toml::detail::character<(char)90>,toml::detail::character<(char)122>,toml::detail::sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>>>>
                     *)this,loc);
  if (token.is_ok_ == true) {
    std::__cxx11::string::string((string *)&local_f8,(string *)(this + 0x20));
    pvVar4 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap(&token);
    region<std::vector<char,std::allocator<char>>>::str_abi_cxx11_(&local_118,pvVar4);
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    location(&inner_loc,&local_f8,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    parse_local_datetime<std::__cxx11::string>(&datetime,(detail *)&inner_loc,loc_00);
    if ((datetime.is_ok_ != true) ||
       (inner_loc.iter_._M_current ==
        ((inner_loc.source_.
          super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_M_dataplus)._M_p +
        (inner_loc.source_.
         super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_M_string_length)) {
      piVar6 = (internal_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,
                 "[error]: toml::parse_offset_datetime: invalid datetime format",
                 (allocator<char> *)&local_250);
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&inner_loc;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[19],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&ofs,(location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          **)&local_1d8,(char (*) [19])"date, not datetime");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&ofs;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_278,__l_00,&local_29a);
      local_248._M_allocated_capacity = 0;
      local_248._8_8_ = 0;
      local_238._M_current = (char *)0x0;
      format_underline(&str,&local_298,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_278,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_248);
      internal_error::internal_error(piVar6,&str);
      __cxa_throw(piVar6,&internal_error::typeinfo,internal_error::~internal_error);
    }
    ctx = &inner_loc;
    sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>
    ::invoke<std::__cxx11::string>
              (&ofs,(sequence<toml::detail::either<toml::detail::character<(char)43>,toml::detail::character<(char)45>>,toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::character<(char)58>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>>>
                     *)&inner_loc,loc_01);
    if (ofs.is_ok_ == true) {
      this_00 = result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
                ::unwrap(&ofs);
      region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::str
                (&str,this_00);
      if (*(char *)CONCAT44(str._M_dataplus._M_p._4_4_,str._M_dataplus._M_p._0_4_) == '+') {
        std::__cxx11::string::substr((ulong)&local_298,(ulong)&str);
        local_278._0_4_ = 0;
        iVar2 = from_string<int,int>(&local_298,(int *)local_278);
        uVar7 = (ushort)iVar2;
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::substr((ulong)&local_298,(ulong)&str);
        ctx = (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_278;
        local_278._0_8_ = (ulong)(uint)local_278._4_4_ << 0x20;
        iVar2 = from_string<int,int>(&local_298,(int *)ctx);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_298,(ulong)&str);
        local_278._0_4_ = 0;
        iVar3 = from_string<int,int>(&local_298,(int *)local_278);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::substr((ulong)&local_298,(ulong)&str);
        ctx = (location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_278;
        local_278._0_8_ = (ulong)(uint)local_278._4_4_ << 0x20;
        iVar2 = from_string<int,int>(&local_298,(int *)ctx);
        uVar7 = -(short)iVar3;
        iVar2 = -iVar2;
      }
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&str);
      uVar8 = (ushort)(iVar2 << 8);
      uVar7 = uVar7 & 0xff;
    }
    else {
      if ((byte)(*inner_loc.iter_._M_current | 0x20U) != 0x7a) {
        piVar6 = (internal_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_278,
                   "[error]: toml::parse_offset_datetime: invalid datetime format",
                   (allocator<char> *)&local_29a);
        local_250 = &inner_loc;
        std::
        pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::detail::location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_char_(&)[26],_true>
                  ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&str,&local_250,(char (*) [26])"should be `Z` or `+HH:MM`");
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&str;
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_248,__l_01,&local_299);
        local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_298,(string *)local_278,
                         (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_248,&local_1d8);
        internal_error::internal_error(piVar6,&local_298);
        __cxa_throw(piVar6,&internal_error::typeinfo,internal_error::~internal_error);
      }
      uVar7 = 0;
      uVar8 = 0;
    }
    result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
    ::cleanup(&ofs,(EVP_PKEY_CTX *)ctx);
    pvVar5 = result<std::pair<toml::local_datetime,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap(&datetime);
    lVar1 = (pvVar5->first).date;
    local_298._M_string_length._0_2_ = (pvVar5->first).time.nanosecond;
    local_298._M_dataplus._M_p = *(pointer *)&(pvVar5->first).time;
    pvVar4 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap(&token);
    str._M_string_length._6_2_ = uVar7 | uVar8;
    str._M_dataplus._M_p._4_4_ = SUB84(local_298._M_dataplus._M_p,0);
    str._M_string_length._0_4_ = (undefined4)((ulong)local_298._M_dataplus._M_p >> 0x20);
    str._M_string_length._4_2_ = (uint16_t)local_298._M_string_length;
    str._M_dataplus._M_p._0_4_ = lVar1;
    region<std::vector<char,_std::allocator<char>_>_>::region
              ((region<std::vector<char,_std::allocator<char>_>_> *)&str.field_2,pvVar4);
    this_01 = (pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
               *)&ofs;
    std::
    pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::
    pair(this_01,(pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
                  *)&str);
    result<std::pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(success_type *)this_01);
    region<std::vector<char,_std::allocator<char>_>_>::~region
              ((region<std::vector<char,_std::allocator<char>_>_> *)&ofs.field_1.succ.value.source_)
    ;
    region<std::vector<char,_std::allocator<char>_>_>::~region
              ((region<std::vector<char,_std::allocator<char>_>_> *)&str.field_2);
    result<std::pair<toml::local_datetime,_toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup(&datetime,(EVP_PKEY_CTX *)this_01);
    location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~location(&inner_loc);
  }
  else {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inner_loc,"[error]: toml::parse_offset_datetime: ",
               (allocator<char> *)&local_1d8);
    local_248._M_allocated_capacity = (size_type)this;
    std::
    pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[40],_true>
              ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&datetime,
               (location<std::vector<char,_std::allocator<char>_>_> **)
               &local_248._M_allocated_capacity,
               (char (*) [40])"the next token is not a offset_datetime");
    __l._M_len = 1;
    __l._M_array = (iterator)&datetime;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_298,__l,(allocator_type *)&local_250);
    local_278._0_8_ = (_func_int **)0x0;
    local_278._8_8_ = (pointer)0x0;
    local_278._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    format_underline(&str,(string *)&inner_loc,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_298,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_278);
    ofs._0_8_ = CONCAT44(str._M_dataplus._M_p._4_4_,str._M_dataplus._M_p._0_4_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ofs._0_8_ == &str.field_2) {
      ofs.field_1.succ.value.source_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)
           (__shared_count<(__gnu_cxx::_Lock_policy)2>)str.field_2._8_8_;
      ofs._0_8_ = (undefined1 *)((long)&ofs.field_1 + 8);
    }
    str._M_string_length._0_4_ = 0;
    str._M_string_length._4_2_ = 0;
    str._M_string_length._6_2_ = 0;
    str.field_2._M_local_buf[0] = '\0';
    this_01 = (pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>
               *)&ofs;
    str._M_dataplus._M_p = (pointer)&str.field_2;
    result<std::pair<toml::offset_datetime,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(failure_type *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_278);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_298);
    std::__cxx11::string::~string((string *)&datetime.field_1.succ);
    std::__cxx11::string::~string((string *)&inner_loc);
  }
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  cleanup(&token,(EVP_PKEY_CTX *)this_01);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<offset_datetime, region<Container>>, std::string>
parse_offset_datetime(location<Container>& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_offset_date_time::invoke(loc))
    {
        location<std::string> inner_loc(loc.name(), token.unwrap().str());
        const auto datetime = parse_local_datetime(inner_loc);
        if(!datetime || inner_loc.iter() == inner_loc.end())
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_offset_datetime: invalid datetime format",
                {{std::addressof(inner_loc), "date, not datetime"}}));
        }
        time_offset offset(0, 0);
        if(const auto ofs = lex_time_numoffset::invoke(inner_loc))
        {
            const auto str = ofs.unwrap().str();
            if(str.front() == '+')
            {
                offset.hour   = static_cast<std::int8_t>(from_string<int>(str.substr(1,2), 0));
                offset.minute = static_cast<std::int8_t>(from_string<int>(str.substr(4,2), 0));
            }
            else
            {
                offset.hour   = -static_cast<std::int8_t>(from_string<int>(str.substr(1,2), 0));
                offset.minute = -static_cast<std::int8_t>(from_string<int>(str.substr(4,2), 0));
            }
        }
        else if(*inner_loc.iter() != 'Z' && *inner_loc.iter() != 'z')
        {
            throw internal_error(format_underline("[error]: "
                "toml::parse_offset_datetime: invalid datetime format",
                {{std::addressof(inner_loc), "should be `Z` or `+HH:MM`"}}));
        }
        return ok(std::make_pair(offset_datetime(datetime.unwrap().first, offset),
                                 token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("[error]: toml::parse_offset_datetime: ",
            {{std::addressof(loc), "the next token is not a offset_datetime"}}));
    }
}